

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

exr_result_t
exr_encoding_initialize
          (exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
          exr_encode_pipeline_t *encode)

{
  void *in_RCX;
  void *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_encode_pipeline_t nil;
  exr_result_t rv;
  undefined1 local_228 [24];
  _internal_exr_part *in_stack_fffffffffffffdf0;
  _internal_exr_context *in_stack_fffffffffffffdf8;
  exr_chunk_info_t *in_stack_fffffffffffffe00;
  exr_coding_channel_info_t *in_stack_fffffffffffffe08;
  int16_t *in_stack_fffffffffffffe10;
  exr_coding_channel_info_t **in_stack_fffffffffffffe18;
  exr_result_t local_4;
  
  memset(local_228,0,0x1f8);
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else if ((in_RDX == (void *)0x0) || (in_RCX == (void *)0x0)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->standard_error)(in_RDI,3);
    }
    else if (in_RDI->mode == '\x03') {
      memcpy(in_RCX,local_228,0x1f8);
      local_4 = internal_coding_fill_channel_info
                          (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                           in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                           in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      if (local_4 == 0) {
        *(uint *)((long)in_RCX + 0xc) = in_ESI;
        *(_internal_exr_context **)((long)in_RCX + 0x10) = in_RDI;
        memcpy((void *)((long)in_RCX + 0x18),in_RDX,0x40);
      }
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
    }
    else if (in_RDI->mode == '\x01') {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->standard_error)(in_RDI,9);
    }
    else {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->standard_error)(in_RDI,8);
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_encoding_initialize (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_encode_pipeline_t*  encode)
{
    exr_result_t          rv;
    exr_encode_pipeline_t nil = {0};

    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!cinfo || !encode)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (pctxt->mode != EXR_CONTEXT_WRITING_DATA)
    {
        if (pctxt->mode == EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
                pctxt->standard_error (pctxt, EXR_ERR_HEADER_NOT_WRITTEN));
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    }

    *encode = nil;

    rv = internal_coding_fill_channel_info (
        &(encode->channels),
        &(encode->channel_count),
        encode->_quick_chan_store,
        cinfo,
        pctxt,
        part);

    if (rv == EXR_ERR_SUCCESS)
    {
        encode->part_index = part_index;
        encode->context    = ctxt;
        encode->chunk      = *cinfo;
    }
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (rv);
}